

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_> __thiscall
interfaces::MakeWallet(interfaces *this,WalletContext *context,shared_ptr<wallet::CWallet> *wallet)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 *puVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = (wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    puVar4 = (undefined8 *)0x0;
  }
  else {
    puVar4 = (undefined8 *)operator_new(0x20);
    *puVar4 = &PTR__WalletImpl_013b78f0;
    puVar4[1] = context;
    puVar4[2] = peVar2;
    p_Var3 = (wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    puVar4[3] = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(p_Var3 + 8) = *(int *)(p_Var3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(p_Var3 + 8) = *(int *)(p_Var3 + 8) + 1;
      }
    }
  }
  *(undefined8 **)this = puVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Wallet,_std::default_delete<interfaces::Wallet>,_true,_true>
           )(__uniq_ptr_data<interfaces::Wallet,_std::default_delete<interfaces::Wallet>,_true,_true>
             )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Wallet> MakeWallet(wallet::WalletContext& context, const std::shared_ptr<wallet::CWallet>& wallet) { return wallet ? std::make_unique<wallet::WalletImpl>(context, wallet) : nullptr; }